

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_EnvelopeADSR(ym3438_t *chip)

{
  Bit8u BVar1;
  Bit8u BVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool local_25;
  short local_24;
  Bit8u local_21;
  ushort local_20;
  ushort local_1e;
  Bit16s inc;
  Bit8u nextstate;
  Bit16s ssg_level;
  Bit16s nextlevel;
  Bit16s level;
  Bit8u eg_off;
  Bit8u koff_event;
  Bit8u kon_event;
  Bit8u okon;
  Bit8u nkon;
  Bit32u slot;
  ym3438_t *chip_local;
  
  uVar4 = (chip->cycles + 0x16) % 0x18;
  BVar1 = chip->eg_kon_latch[uVar4];
  BVar2 = chip->eg_kon[uVar4];
  local_21 = chip->eg_state[uVar4];
  local_24 = 0;
  chip->eg_read[0] = (uint)chip->eg_read_inc;
  chip->eg_read_inc = chip->eg_inc != '\0';
  if ((BVar1 == '\0') || (local_25 = true, BVar2 != '\0')) {
    local_25 = chip->eg_ssg_pgrst_latch[uVar4] != '\0';
  }
  chip->pg_reset[uVar4] = local_25;
  if (((BVar1 == '\0') || (bVar5 = true, BVar2 != '\0')) && (bVar5 = false, BVar2 != '\0')) {
    bVar5 = chip->eg_ssg_repeat_latch[uVar4] != '\0';
  }
  inc = chip->eg_level[uVar4];
  local_20 = inc;
  if (chip->eg_ssg_inv[uVar4] != '\0') {
    local_20 = 0x200U - inc & 0x3ff;
  }
  if (BVar2 != '\0' && BVar1 == '\0') {
    inc = local_20;
  }
  if (chip->eg_ssg_enable[uVar4] == '\0') {
    nextstate = (inc & 0x3f0U) == 0x3f0;
  }
  else {
    nextstate = (Bit8u)(inc >> 9);
  }
  local_1e = inc;
  if (bVar5) {
    local_21 = '\0';
    if (chip->eg_ratemax == '\0') {
      if (((chip->eg_state[uVar4] == '\0') && (inc != 0)) &&
         ((chip->eg_inc != '\0' && (BVar1 != '\0')))) {
        local_24 = (short)((int)(((int)inc ^ 0xffffffffU) << (chip->eg_inc & 0x1f)) >> 5);
      }
    }
    else {
      local_1e = 0;
    }
  }
  else {
    uVar3 = (uint)chip->eg_state[uVar4];
    if (uVar3 == 0) {
      if (inc == 0) {
        local_21 = '\x01';
      }
      else if (((chip->eg_inc != '\0') && (chip->eg_ratemax == '\0')) && (BVar1 != '\0')) {
        local_24 = (short)((int)(((int)inc ^ 0xffffffffU) << (chip->eg_inc & 0x1f)) >> 5);
      }
    }
    else if (uVar3 == 1) {
      if (inc >> 5 == (ushort)chip->eg_sl[1]) {
        local_21 = '\x02';
      }
      else if (((nextstate == '\0') && (chip->eg_inc != '\0')) &&
              (local_24 = (short)(1 << (chip->eg_inc - 1 & 0x1f)),
              chip->eg_ssg_enable[uVar4] != '\0')) {
        local_24 = local_24 << 2;
      }
    }
    else if ((((uVar3 - 2 < 2) && (nextstate == '\0')) && (chip->eg_inc != '\0')) &&
            (local_24 = (short)(1 << (chip->eg_inc - 1 & 0x1f)), chip->eg_ssg_enable[uVar4] != '\0')
            ) {
      local_24 = local_24 << 2;
    }
    if (BVar1 == '\0') {
      local_21 = '\x03';
    }
  }
  if (chip->eg_kon_csm[uVar4] != '\0') {
    local_1e = local_1e | (ushort)chip->eg_tl[1] << 3;
  }
  if (((!bVar5) && (chip->eg_ssg_hold_up_latch[uVar4] == '\0')) &&
     ((chip->eg_state[uVar4] != '\0' && (nextstate != '\0')))) {
    local_21 = '\x03';
    local_1e = 0x3ff;
  }
  chip->eg_kon[uVar4] = chip->eg_kon_latch[uVar4];
  chip->eg_level[uVar4] = local_1e + local_24 & 0x3ff;
  chip->eg_state[uVar4] = local_21;
  return;
}

Assistant:

void NOPN2_EnvelopeADSR(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 22) % 24;

    Bit8u nkon = chip->eg_kon_latch[slot];
    Bit8u okon = chip->eg_kon[slot];
    Bit8u kon_event;
    Bit8u koff_event;
    Bit8u eg_off;
    Bit16s level;
    Bit16s nextlevel = 0;
    Bit16s ssg_level;
    Bit8u nextstate = chip->eg_state[slot];
    Bit16s inc = 0;
    chip->eg_read[0] = chip->eg_read_inc;
    chip->eg_read_inc = chip->eg_inc > 0;

    /* Reset phase generator */
    chip->pg_reset[slot] = (nkon && !okon) || chip->eg_ssg_pgrst_latch[slot];

    /* KeyOn/Off */
    kon_event = (nkon && !okon) || (okon && chip->eg_ssg_repeat_latch[slot]);
    koff_event = okon && !nkon;

    ssg_level = level = (Bit16s)chip->eg_level[slot];

    if (chip->eg_ssg_inv[slot])
    {
        /* Inverse */
        ssg_level = 512 - level;
        ssg_level &= 0x3ff;
    }
    if (koff_event)
    {
        level = ssg_level;
    }
    if (chip->eg_ssg_enable[slot])
    {
        eg_off = level >> 9;
    }
    else
    {
        eg_off = (level & 0x3f0) == 0x3f0;
    }
    nextlevel = level;
    if (kon_event)
    {
        nextstate = eg_num_attack;
        /* Instant attack */
        if (chip->eg_ratemax)
        {
            nextlevel = 0;
        }
        else if (chip->eg_state[slot] == eg_num_attack && level != 0 && chip->eg_inc && nkon)
        {
            inc = (~level << chip->eg_inc) >> 5;
        }
    }
    else
    {
        switch (chip->eg_state[slot])
        {
        case eg_num_attack:
            if (level == 0)
            {
                nextstate = eg_num_decay;
            }
            else if(chip->eg_inc && !chip->eg_ratemax && nkon)
            {
                inc = (~level << chip->eg_inc) >> 5;
            }
            break;
        case eg_num_decay:
            if ((level >> 5) == chip->eg_sl[1])
            {
                nextstate = eg_num_sustain;
            }
            else if (!eg_off && chip->eg_inc)
            {
                inc = 1 << (chip->eg_inc - 1);
                if (chip->eg_ssg_enable[slot])
                {
                    inc <<= 2;
                }
            }
            break;
        case eg_num_sustain:
        case eg_num_release:
            if (!eg_off && chip->eg_inc)
            {
                inc = 1 << (chip->eg_inc - 1);
                if (chip->eg_ssg_enable[slot])
                {
                    inc <<= 2;
                }
            }
            break;
        default:
            break;
        }
        if (!nkon)
        {
            nextstate = eg_num_release;
        }
    }
    if (chip->eg_kon_csm[slot])
    {
        nextlevel |= chip->eg_tl[1] << 3;
    }

    /* Envelope off */
    if (!kon_event && !chip->eg_ssg_hold_up_latch[slot] && chip->eg_state[slot] != eg_num_attack && eg_off)
    {
        nextstate = eg_num_release;
        nextlevel = 0x3ff;
    }

    nextlevel += inc;

    chip->eg_kon[slot] = chip->eg_kon_latch[slot];
    chip->eg_level[slot] = (Bit16u)nextlevel & 0x3ff;
    chip->eg_state[slot] = nextstate;
}